

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r7pfr.cpp
# Opt level: O3

int solver_R7Pfr(Matrix<double,_35,_1,_0,_35,_1> *data,
                Matrix<std::complex<double>,_4,_10,_0,_4,_10> *sols)

{
  double *pdVar1;
  undefined4 *puVar2;
  undefined8 uVar3;
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  short *psVar11;
  double *pdVar12;
  undefined1 *puVar13;
  complex<double> *pcVar14;
  complex<double> *pcVar15;
  Index outer_1;
  assign_op<std::complex<double>,_std::complex<double>_> *paVar16;
  Index outer;
  long lVar17;
  undefined8 *puVar18;
  ulong uVar19;
  Index row_1;
  ulong uVar20;
  Index inner;
  ulong uVar21;
  long lVar22;
  undefined8 extraout_XMM0_Qa;
  double dVar23;
  int iVar24;
  long lVar25;
  undefined1 auVar26 [16];
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> eig;
  Matrix<std::complex<double>,_10,_1,_0,_10,_1> scale;
  Matrix<double,_10,_10,_0,_10,_10> AM;
  Matrix<double,_17,_10,_0,_17,_10> RR;
  Matrix<std::complex<double>,_10,_10,_0,_10,_10> V;
  Matrix<double,_26,_10,_0,_26,_10> C1;
  Matrix<double,_26,_26,_0,_26,_26> C0;
  assign_op<std::complex<double>,_std::complex<double>_> local_4499;
  double local_4498;
  double local_4490;
  double local_4488;
  plainobjectbase_evaluator_data<std::complex<double>,_10> local_4480 [21];
  undefined1 local_43d8 [16];
  undefined8 local_43c8;
  Transpose<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_> local_43c0 [2];
  EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_43b0;
  Matrix<std::complex<double>,_10,_1,_0,_10,_1> local_42c8;
  EigenBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> local_4228 [80];
  undefined8 auStack_41d8 [10];
  undefined8 auStack_4188 [10];
  undefined8 auStack_4138 [10];
  undefined8 auStack_40e8 [10];
  undefined8 auStack_4098 [10];
  undefined8 auStack_4048 [10];
  undefined8 auStack_3ff8 [10];
  undefined8 auStack_3fa8 [10];
  undefined8 auStack_3f58 [10];
  double local_3f08 [7];
  undefined1 local_3ed0 [80];
  undefined8 auStack_3e80 [17];
  undefined8 auStack_3df8 [17];
  undefined8 auStack_3d70 [17];
  undefined8 auStack_3ce8 [17];
  undefined8 auStack_3c60 [17];
  undefined8 auStack_3bd8 [17];
  undefined8 auStack_3b50 [17];
  undefined8 auStack_3ac8 [17];
  undefined8 auStack_3a40 [17];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>,_Eigen::internal::evaluator<Eigen::Matrix<std::complex<double>,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<std::complex<double>,_std::complex<double>_>,_0>
  local_39b8;
  double local_3998;
  double dStack_3990;
  double local_3988;
  double local_3980;
  double local_3978;
  double local_3970;
  double local_3968;
  double dStack_3960;
  double local_3958;
  double local_3950;
  double local_3948;
  double local_3940;
  double dStack_3938;
  double local_3930;
  double local_3928;
  undefined8 local_3920;
  double local_3918;
  double dStack_3910;
  double local_3908;
  double local_3900;
  double dStack_38f8;
  double local_38f0;
  double dStack_38e8;
  double local_38e0;
  double dStack_38d8;
  double local_38d0;
  double local_38c8;
  double dStack_38c0;
  double local_38b8;
  double dStack_38b0;
  undefined8 local_23c8;
  undefined2 local_23c0 [4];
  complex<double> local_23b8 [9];
  undefined8 local_2320 [181];
  undefined1 local_1d78 [152];
  double local_1ce0 [241];
  EigenBase<Eigen::Matrix<double,_26,_26,_0,_26,_26>_> local_1558 [5416];
  
  local_3980 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[0];
  dStack_3990 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
                m_data.array[2];
  local_3978 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[3];
  local_3948 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[7];
  local_3958 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[8];
  local_4498 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[0xd];
  local_3950 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[0x11];
  local_3930 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[0x14];
  local_4490 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[0x15];
  local_4488 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[0x1c];
  local_39b8.m_dst =
       (DstEvaluatorType *)
       ((ulong)(data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[0xf] ^ 0x8000000000000000);
  local_39b8.m_src =
       (SrcEvaluatorType *)
       ((ulong)(data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[0x10] ^ 0x8000000000000000);
  local_39b8.m_functor =
       (assign_op<std::complex<double>,_std::complex<double>_> *)
       ((ulong)(data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[0xe] ^ 0x8000000000000000);
  local_39b8.m_dstExpr =
       (DstXprType *)
       ((data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.m_data.
        array[1] - local_3950);
  local_3998 = -(data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
                m_data.array[0x12];
  local_3988 = -(data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
                m_data.array[0x13];
  local_3970 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[4] - local_3930;
  local_3968 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[5];
  dStack_3960 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
                m_data.array[6];
  local_3950 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[9] - local_3950;
  local_3940 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[10];
  dStack_3938 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
                m_data.array[0xb];
  local_3930 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[0xc] - local_3930;
  local_3920 = 0x3ff0000000000000;
  local_3918 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[0x16];
  dStack_3910 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
                m_data.array[0x17];
  local_3900 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[0x18];
  dStack_38f8 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
                m_data.array[0x19];
  local_38f0 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[0x1a];
  dStack_38e8 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
                m_data.array[0x1b];
  local_38e0 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[0x1d];
  dStack_38d8 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
                m_data.array[0x1e];
  local_38c8 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[0x1f];
  dStack_38c0 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
                m_data.array[0x20];
  local_38b8 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
               m_data.array[0x21];
  dStack_38b0 = (data->super_PlainObjectBase<Eigen::Matrix<double,_35,_1,_0,_35,_1>_>).m_storage.
                m_data.array[0x22];
  lVar22 = 0;
  local_3928 = local_4498;
  local_3908 = local_4490;
  local_38d0 = local_4488;
  memset(local_1558,0,0x1520);
  memset(local_1d78,0,0x820);
  psVar11 = &setup_elimination_template(Eigen::Matrix<double,int,int,int,int,int>,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
             ::iv0;
  do {
    *(DstEvaluatorType **)(local_1558 + (long)*psVar11 * 8) =
         (&local_39b8.m_dst)
         [(char)(&setup_elimination_template(Eigen::Matrix<double,int,int,int,int,int>,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
                  ::iv1)[lVar22]];
    lVar22 = lVar22 + 1;
    psVar11 = psVar11 + 1;
  } while (lVar22 != 0x97);
  lVar22 = 0;
  do {
    *(DstEvaluatorType **)
     (local_1d78 +
     (ulong)(byte)(&setup_elimination_template(Eigen::Matrix<double,int,int,int,int,int>,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
                    ::uv0)[lVar22] * 8) =
         (&local_39b8.m_dst)
         [(char)(&setup_elimination_template(Eigen::Matrix<double,int,int,int,int,int>,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
                  ::iv2)[lVar22]];
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x57);
  local_23c8 = 0;
  local_23c0[0] = 0;
  Eigen::PartialPivLU<Eigen::Matrix<double,26,26,0,26,26>>::
  compute<Eigen::Matrix<double,26,26,0,26,26>>
            ((PartialPivLU<Eigen::Matrix<double,26,26,0,26,26>> *)&local_39b8,local_1558);
  Eigen::PartialPivLU<Eigen::Matrix<double,26,26,0,26,26>>::
  _solve_impl<Eigen::Matrix<double,26,10,0,26,10>,Eigen::Matrix<double,26,10,0,26,10>>
            ((PartialPivLU<Eigen::Matrix<double,26,26,0,26,26>> *)&local_39b8,
             (Matrix<double,_26,_10,_0,_26,_10> *)local_1d78,
             (Matrix<double,_26,_10,_0,_26,_10> *)local_1d78);
  pdVar12 = local_3f08;
  lVar22 = 0;
  uVar19 = 0;
  puVar13 = local_1d78 + 0x98;
  do {
    uVar20 = uVar19 | 6;
    uVar21 = uVar19;
    if (uVar19 != 0) {
      local_3f08[lVar22 * 0x11] = -*(double *)(local_1558 + lVar22 * 0xd0 + -0x788);
    }
    do {
      puVar2 = (undefined4 *)(puVar13 + uVar21 * 8);
      uVar4 = puVar2[1];
      uVar5 = puVar2[2];
      uVar6 = puVar2[3];
      pdVar1 = pdVar12 + uVar21;
      *(undefined4 *)pdVar1 = *puVar2;
      *(uint *)((long)pdVar1 + 4) = uVar4 ^ 0x80000000;
      *(undefined4 *)(pdVar1 + 1) = uVar5;
      *(uint *)((long)pdVar1 + 0xc) = uVar6 ^ 0x80000000;
      uVar21 = uVar21 + 2;
    } while (uVar21 < uVar20);
    if (uVar19 == 0) {
      local_3f08[lVar22 * 0x11 + uVar20] =
           -*(double *)(local_1d78 + 0x98 + (lVar22 * 0x1a + uVar20) * 8);
    }
    uVar19 = (ulong)(~(uint)uVar19 & 1);
    lVar22 = lVar22 + 1;
    puVar13 = puVar13 + 0xd0;
    pdVar12 = pdVar12 + 0x11;
  } while (lVar22 != 10);
  puVar13 = local_3ed0;
  lVar22 = 0;
  do {
    iVar24 = (int)((ulong)lVar22 >> 0x20);
    lVar17 = 0;
    auVar26 = _DAT_00143240;
    do {
      lVar25 = auVar26._8_8_;
      puVar2 = (undefined4 *)(puVar13 + lVar17 * 8);
      *puVar2 = 0;
      puVar2[1] = -(uint)(auVar26._0_4_ == (int)lVar22 && auVar26._4_4_ == iVar24) & 0x3ff00000;
      puVar2[2] = 0;
      puVar2[3] = -(uint)(auVar26._8_4_ == (int)lVar22 && auVar26._12_4_ == iVar24) & 0x3ff00000;
      lVar17 = lVar17 + 2;
      auVar26._0_8_ = auVar26._0_8_ + 2;
      auVar26._8_8_ = lVar25 + 2;
    } while (lVar17 != 10);
    lVar22 = lVar22 + 1;
    puVar13 = puVar13 + 0x88;
  } while (lVar22 != 10);
  lVar22 = 0;
  do {
    iVar24 = *(int *)((long)&DAT_001435a0 + lVar22);
    uVar3 = auStack_3e80[iVar24];
    *(double *)(local_4228 + lVar22 * 2) = local_3f08[iVar24];
    *(undefined8 *)((long)auStack_41d8 + lVar22 * 2) = uVar3;
    *(undefined8 *)((long)auStack_4188 + lVar22 * 2) = auStack_3df8[iVar24];
    *(undefined8 *)((long)auStack_4138 + lVar22 * 2) = auStack_3d70[iVar24];
    *(undefined8 *)((long)auStack_40e8 + lVar22 * 2) = auStack_3ce8[iVar24];
    *(undefined8 *)((long)auStack_4098 + lVar22 * 2) = auStack_3c60[iVar24];
    *(undefined8 *)((long)auStack_4048 + lVar22 * 2) = auStack_3bd8[iVar24];
    *(undefined8 *)((long)auStack_3ff8 + lVar22 * 2) = auStack_3b50[iVar24];
    *(undefined8 *)((long)auStack_3fa8 + lVar22 * 2) = auStack_3ac8[iVar24];
    *(undefined8 *)((long)auStack_3f58 + lVar22 * 2) = auStack_3a40[iVar24];
    lVar22 = lVar22 + 4;
  } while (lVar22 != 0x28);
  Eigen::EigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  EigenSolver<Eigen::Matrix<double,10,10,0,10,10>>
            ((EigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_43b0,local_4228,true);
  local_4480[1].data =
       *(complex<double> **)
        (local_43b0.m_eivalues.
         super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
        m_data)->_M_value;
  local_4480[2].data =
       *(complex<double> **)
        ((long)(local_43b0.m_eivalues.
                super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.
                m_storage.m_data)->_M_value + 8);
  local_4480[3].data =
       *(complex<double> **)
        local_43b0.m_eivalues.
        super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[1]._M_value;
  local_4480[4].data =
       *(complex<double> **)
        (local_43b0.m_eivalues.
         super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
         m_data[1]._M_value + 8);
  local_4480[5].data =
       *(complex<double> **)
        local_43b0.m_eivalues.
        super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[2]._M_value;
  local_4480[6].data =
       *(complex<double> **)
        (local_43b0.m_eivalues.
         super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
         m_data[2]._M_value + 8);
  local_4480[7].data =
       *(complex<double> **)
        local_43b0.m_eivalues.
        super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[3]._M_value;
  local_4480[8].data =
       *(complex<double> **)
        (local_43b0.m_eivalues.
         super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
         m_data[3]._M_value + 8);
  local_4480[9].data =
       *(complex<double> **)
        local_43b0.m_eivalues.
        super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[4]._M_value;
  local_4480[10].data =
       *(complex<double> **)
        (local_43b0.m_eivalues.
         super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
         m_data[4]._M_value + 8);
  local_4480[0xb].data =
       *(complex<double> **)
        local_43b0.m_eivalues.
        super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[5]._M_value;
  local_4480[0xc].data =
       *(complex<double> **)
        (local_43b0.m_eivalues.
         super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
         m_data[5]._M_value + 8);
  local_4480[0xd].data =
       *(complex<double> **)
        local_43b0.m_eivalues.
        super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[6]._M_value;
  local_4480[0xe].data =
       *(complex<double> **)
        (local_43b0.m_eivalues.
         super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
         m_data[6]._M_value + 8);
  local_4480[0xf].data =
       *(complex<double> **)
        local_43b0.m_eivalues.
        super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[7]._M_value;
  local_4480[0x10].data =
       *(complex<double> **)
        (local_43b0.m_eivalues.
         super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
         m_data[7]._M_value + 8);
  local_4480[0x11].data =
       *(complex<double> **)
        local_43b0.m_eivalues.
        super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[8]._M_value;
  local_4480[0x12].data =
       *(complex<double> **)
        (local_43b0.m_eivalues.
         super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
         m_data[8]._M_value + 8);
  local_4480[0x13].data =
       *(complex<double> **)
        local_43b0.m_eivalues.
        super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[9]._M_value;
  local_4480[0x14].data =
       *(complex<double> **)
        (local_43b0.m_eivalues.
         super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
         m_data[9]._M_value + 8);
  Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvectors
            ((EigenvectorsType *)&local_42c8,&local_43b0);
  pcVar15 = local_23b8;
  memset(pcVar15,0,0x640);
  local_39b8.m_src = (SrcEvaluatorType *)local_43d8;
  local_43d8._0_8_ =
       local_42c8.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[0]._M_value._0_8_;
  local_43d8._8_8_ =
       local_42c8.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[0]._M_value._8_8_;
  local_39b8.m_dst = (DstEvaluatorType *)local_4480;
  local_39b8.m_functor = &local_4499;
  local_4480[0].data = pcVar15;
  local_39b8.m_dstExpr = (DstXprType *)pcVar15;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_>,_Eigen::internal::evaluator<Eigen::Matrix<std::complex<double>,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<std::complex<double>,_std::complex<double>_>,_0>,_2,_1>
  ::run(&local_39b8);
  free((void *)local_42c8.
               super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>.
               m_storage.m_data.array[0]._M_value._0_8_);
  memset(&local_42c8,0,0xa0);
  lVar22 = 8;
  puVar18 = local_2320;
  do {
    auVar26 = __divdc3(*(undefined8 *)((long)&local_4480[0].data + lVar22),
                       *(undefined8 *)((long)&local_4480[1].data + lVar22),puVar18[-1],*puVar18);
    *(long *)((long)local_42c8.
                    super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>.
                    m_storage.m_data.array[0]._M_value + lVar22 + -8) = auVar26._0_8_;
    *(long *)(local_42c8.
              super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_1,_0,_10,_1>_>.m_storage
              .m_data.array[0]._M_value + lVar22) = auVar26._8_8_;
    lVar22 = lVar22 + 0x10;
    puVar18 = puVar18 + 0x14;
  } while (lVar22 != 0xa8);
  local_43c8 = 0x3ff0000000000000;
  local_43d8._0_8_ = pcVar15;
  local_43c0[0].m_matrix = &local_42c8;
  local_39b8.m_src = (SrcEvaluatorType *)pcVar15;
  memset((assign_op<std::complex<double>,_std::complex<double>_> *)&local_3998,0,0x640);
  local_39b8.m_functor = (assign_op<std::complex<double>,_std::complex<double>_> *)&local_3998;
  Eigen::internal::
  outer_product_selector_run<Eigen::Matrix<std::complex<double>,10,10,0,10,10>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,10,1,0,10,1>>,Eigen::Transpose<Eigen::Matrix<std::complex<double>,10,1,0,10,1>>,Eigen::internal::generic_product_impl<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,10,1,0,10,1>>,Eigen::Transpose<Eigen::Matrix<std::complex<double>,10,1,0,10,1>>,Eigen::DenseShape,Eigen::DenseShape,5>::set>
            ((Matrix<std::complex<double>,_10,_10,_0,_10,_10> *)&local_3998,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>_>
              *)(local_43d8 + 8),local_43c0,(set *)local_4480,(false_type *)&local_4499);
  lVar22 = 0;
  pcVar14 = (complex<double> *)local_39b8.m_src;
  paVar16 = local_39b8.m_functor;
  do {
    lVar17 = 0;
    do {
      dVar7 = *(double *)(paVar16 + lVar17);
      dVar8 = *(double *)(paVar16 + lVar17 + 8);
      pdVar12 = (double *)((long)pcVar14->_M_value + lVar17);
      dVar9 = *pdVar12;
      dVar10 = pdVar12[1];
      dVar23 = -(dVar8 * dVar10) + dVar9 * dVar7;
      pdVar12 = (double *)
                ((long)(((PlainObjectBase<Eigen::Matrix<std::complex<double>,_10,_10,_0,_10,_10>_> *
                         )pcVar15->_M_value)->m_storage).m_data.array[0]._M_value + lVar17);
      *pdVar12 = dVar23;
      pdVar12[1] = dVar7 * dVar10 + dVar9 * dVar8;
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0xa0);
    lVar22 = lVar22 + 1;
    paVar16 = paVar16 + 0xa0;
    pcVar14 = pcVar14 + 10;
    pcVar15 = pcVar15 + 10;
  } while (lVar22 != 10);
  lVar22 = 0x20;
  pcVar15 = (complex<double> *)sols;
  do {
    uVar3 = *(undefined8 *)(local_23b8[0]._M_value + lVar22 + 8);
    *(undefined8 *)
     (((PlainObjectBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_> *)pcVar15->_M_value)
     ->m_storage).m_data.array[0]._M_value = *(undefined8 *)(local_23b8[0]._M_value + lVar22);
    *(undefined8 *)
     ((((PlainObjectBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_> *)pcVar15->_M_value)
      ->m_storage).m_data.array[0]._M_value + 8) = uVar3;
    lVar22 = lVar22 + 0xa0;
    pcVar15 = pcVar15 + 4;
  } while (lVar22 != 0x660);
  pcVar15 = (sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_>).
            m_storage.m_data.array + 1;
  lVar22 = 0x80;
  do {
    uVar3 = *(undefined8 *)(local_23b8[0]._M_value + lVar22 + 8);
    *(undefined8 *)pcVar15->_M_value = *(undefined8 *)(local_23b8[0]._M_value + lVar22);
    *(undefined8 *)(pcVar15->_M_value + 8) = uVar3;
    lVar22 = lVar22 + 0xa0;
    pcVar15 = pcVar15 + 4;
  } while (lVar22 != 0x6c0);
  lVar22 = 0;
  do {
    uVar3 = *(undefined8 *)((long)&local_4480[2].data + lVar22);
    puVar18 = (undefined8 *)
              ((sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_>).
               m_storage.m_data.array[2]._M_value + lVar22 * 4);
    *puVar18 = *(undefined8 *)((long)&local_4480[1].data + lVar22);
    puVar18[1] = uVar3;
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0xa0);
  pdVar12 = (double *)
            ((sols->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_4,_10,_0,_4,_10>_>).
             m_storage.m_data.array[3]._M_value + 8);
  lVar22 = 0x48;
  do {
    local_39b8.m_dst = (DstEvaluatorType *)0x4000000000000000;
    std::pow<double>((complex<double> *)(pdVar12 + -5),(double *)&local_39b8);
    auVar26 = __divdc3(*(undefined8 *)((long)local_23c0 + lVar22),
                       *(undefined8 *)(local_23b8[0]._M_value + lVar22),extraout_XMM0_Qa,dVar23);
    dVar23 = auVar26._8_8_;
    *(long *)((complex<double> *)(pdVar12 + -1))->_M_value = auVar26._0_8_;
    *pdVar12 = dVar23;
    lVar22 = lVar22 + 0xa0;
    pdVar12 = pdVar12 + 8;
  } while (lVar22 != 0x688);
  free(local_43b0.m_tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free(local_43b0.m_matT.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free(local_43b0.m_realSchur.m_hess.m_temp.
       super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data);
  free(local_43b0.m_realSchur.m_hess.m_hCoeffs.
       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_43b0.m_realSchur.m_hess.m_matrix.
       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_43b0.m_realSchur.m_workspaceVector.
       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_43b0.m_realSchur.m_matU.
       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_43b0.m_realSchur.m_matT.
       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_43b0.m_eivalues.
       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.m_data
      );
  free(local_43b0.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
       .m_data);
  return 0;
}

Assistant:

int solver_R7Pfr(Eigen::Matrix<double,35,1> const data, Eigen::Matrix<std::complex<double>,4,10> & sols){

Eigen::Matrix<double, 26, 26> C0;
Eigen::Matrix<double, 26, 10> C1;

setup_elimination_template(data, C0, C1);



C1 = C0.lu().solve(C1);



Eigen::Matrix<double, 17, 10> RR;

RR.topRows(7) = -C1.bottomRows(7);
RR.bottomRows(10) = Eigen::MatrixXd::Identity(10,10);

int ind[10] = {0,1,8,2,3,10,4,5,13,6};

Eigen::Matrix<double, 10, 10> AM;



for (int i = 0; i < 10; i++)
{
    AM.row(i) = RR.row(ind[i]);
}

Eigen::EigenSolver<Eigen::MatrixXd> eig(AM);
Eigen::Matrix<std::complex<double>,10,1> D = eig.eigenvalues();
Eigen::Matrix<std::complex<double>,10,10> V = eig.eigenvectors();


Eigen::Matrix<std::complex<double>,10,1> scale = D.array()/V.row(9).array().transpose();

V = V.array() * (Eigen::Matrix<double,10,1>::Ones() * scale.transpose()).array();


sols.row(0) << V.row(2);
sols.row(1) << V.row(8);
sols.row(2) << D.transpose();
sols.row(3) << V.row(4).array() / sols.row(1).array().pow(2);
return 0;
}